

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

char * on_msg_str(obj *otmp,boolean delayed,boolean deliberate)

{
  int iVar1;
  flag *in_RAX;
  char *pcVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char how [256];
  char local_118 [256];
  
  if ((otmp != (obj *)0x0) && (in_RAX = &flags, flags.verbose != '\0')) {
    local_118[0] = '\0';
    if (otmp->otyp == 0xef) {
      pcVar2 = body_part(8);
      sprintf(local_118," around your %s",pcVar2);
    }
    pcVar2 = "finish wearing";
    if (delayed == '\0') {
      pcVar2 = "wear";
    }
    pcVar3 = "now wear";
    if (deliberate != '\0') {
      pcVar3 = pcVar2;
    }
    if ((uleft == otmp) || (uright == otmp)) {
      pcVar2 = doname(otmp);
    }
    else {
      pcVar2 = doname_noworn(otmp);
    }
    iVar1 = snprintf(on_msg_str::buf,0x100,"You %s %s%s.",pcVar3,pcVar2,local_118);
    return (char *)CONCAT44(extraout_var,iVar1);
  }
  on_msg_str::buf[0] = '\0';
  return &in_RAX->autodig;
}

Assistant:

static const char *on_msg_str(const struct obj *otmp,
			      boolean delayed, boolean deliberate)
{
	static char buf[BUFSZ];

	if (otmp && flags.verbose) {
	    char how[BUFSZ];
	    how[0] = '\0';

	    if (otmp->otyp == TOWEL)
		sprintf(how, " around your %s", body_part(HEAD));
	    snprintf(buf, BUFSZ, "You %s %s%s.",
		     !deliberate ? "now wear" :
		     delayed ? "finish wearing" : "wear",
		     /* hide "(being worn)" but show "(on left hand)" for rings */
		     (otmp == uleft || otmp == uright) ?
			doname(otmp) : doname_noworn(otmp),
		     how);
	} else {
	    buf[0] = '\0';
	}

	return buf;
}